

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O2

uint32_t helper_dcmpuq(CPUPPCState_conflict *env,ppc_fprp_t *a,ppc_fprp_t *b)

{
  PPC_DFP dfp;
  undefined1 auStack_e8 [100];
  decNumber_conflict local_84 [3];
  decNumber_conflict local_60 [3];
  decContext local_3c;
  byte local_20;
  
  dfp_prepare_decimal128((PPC_DFP *)auStack_e8,a,b,env);
  decNumberCompare((decNumber_conflict *)(auStack_e8 + 0x40),local_84,local_60,&local_3c);
  dfp_finalize_decimal128((PPC_DFP *)auStack_e8);
  CMPU_PPs((PPC_DFP *)auStack_e8);
  return (uint32_t)local_20;
}

Assistant:

static void CMPO_PPs(struct PPC_DFP *dfp)
{
    dfp_set_CRBF_from_T(dfp);
    dfp_set_FPCC_from_CRBF(dfp);
    dfp_check_for_VXSNAN(dfp);
    dfp_check_for_VXVC(dfp);
}